

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O1

void duh_sigrenderer_set_sigparam(DUH_SIGRENDERER *sigrenderer,uchar id,int32 value)

{
  DUH_SIGRENDERER_SET_SIGPARAM UNRECOVERED_JUMPTABLE;
  
  if ((sigrenderer != (DUH_SIGRENDERER *)0x0) &&
     (UNRECOVERED_JUMPTABLE = sigrenderer->desc->sigrenderer_set_sigparam,
     UNRECOVERED_JUMPTABLE != (DUH_SIGRENDERER_SET_SIGPARAM)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(sigrenderer->sigrenderer,id,value);
    return;
  }
  return;
}

Assistant:

void DUMBEXPORT duh_sigrenderer_set_sigparam(
	DUH_SIGRENDERER *sigrenderer,
	unsigned char id, int32 value
)
{
	DUH_SIGRENDERER_SET_SIGPARAM proc;

	if (!sigrenderer) return;

	proc = sigrenderer->desc->sigrenderer_set_sigparam;
	if (proc)
		(*proc)(sigrenderer->sigrenderer, id, value);
	else
		TRACE("Parameter #%d = %d for signal %c%c%c%c, which does not take parameters.\n",
			(int)id,
			value,
			(int)(sigrenderer->desc->type >> 24),
			(int)(sigrenderer->desc->type >> 16),
			(int)(sigrenderer->desc->type >> 8),
			(int)(sigrenderer->desc->type));
}